

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O0

float Amap_ManMaxDelay(Amap_Man_t *p)

{
  int iVar1;
  Amap_Obj_t *pAVar2;
  int local_20;
  float local_1c;
  int i;
  float Delay;
  Amap_Obj_t *pObj;
  Amap_Man_t *p_local;
  
  local_1c = 0.0;
  for (local_20 = 0; iVar1 = Vec_PtrSize(p->vPos), local_20 < iVar1; local_20 = local_20 + 1) {
    pAVar2 = (Amap_Obj_t *)Vec_PtrEntry(p->vPos,local_20);
    pAVar2 = Amap_ObjFanin0(p,pAVar2);
    iVar1 = Abc_MaxInt((int)local_1c,(int)(pAVar2->Best).Delay);
    local_1c = (float)iVar1;
  }
  return local_1c;
}

Assistant:

float Amap_ManMaxDelay( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    float Delay = 0.0;
    int i;
    Amap_ManForEachPo( p, pObj, i )
        Delay = Abc_MaxInt( Delay, Amap_ObjFanin0(p,pObj)->Best.Delay );
    return Delay;
}